

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O1

void __thiscall
cmComputeLinkInformation::AddTargetItem(cmComputeLinkInformation *this,LinkEntry *entry)

{
  pointer pcVar1;
  cmake *this_00;
  size_type sVar2;
  bool bVar3;
  TargetType TVar4;
  int iVar5;
  const_iterator cVar6;
  string *psVar7;
  size_t sVar8;
  const_iterator cVar9;
  FeatureDescriptor *pFVar10;
  char *__s;
  bool bVar11;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar12;
  basic_string_view<char,_std::char_traits<char>_> __str;
  cmGeneratorTarget *target;
  optional<cmGlobalGenerator::FrameworkDescriptor> fwDescriptor;
  cmGeneratorTarget *local_160;
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  undefined8 local_118;
  char *local_110;
  size_type local_108;
  pointer local_100;
  undefined8 local_f8;
  undefined1 *local_f0;
  undefined1 local_e8 [96];
  bool local_88;
  string local_80;
  FeatureDescriptor *local_60;
  undefined1 *local_58;
  undefined1 local_50 [32];
  
  local_160 = entry->Target;
  TVar4 = cmGeneratorTarget::GetType(local_160);
  if (TVar4 != STATIC_LIBRARY) {
    SetCurrentLinkType(this,LinkShared);
  }
  TVar4 = cmGeneratorTarget::GetType(local_160);
  if (TVar4 == SHARED_LIBRARY) {
    std::
    _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
    ::_M_insert_unique<cmGeneratorTarget_const*const&>
              ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                *)&this->SharedLibrariesLinked,&local_160);
  }
  if ((this->NoSONameUsesPath == true) &&
     (bVar3 = cmGeneratorTarget::IsImportedSharedLibWithoutSOName(local_160,&this->Config), bVar3))
  {
    AddSharedLibNoSOName(this,entry);
    return;
  }
  if ((this->OldLinkDirMode != true) ||
     (bVar3 = cmGeneratorTarget::IsFrameworkOnApple(local_160), bVar3)) {
    bVar3 = false;
    bVar11 = false;
  }
  else {
    cmsys::SystemTools::GetFilenamePath(&local_80,(string *)entry);
    cVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(this->OldLinkDirMask)._M_t,&local_80);
    bVar11 = (_Rb_tree_header *)cVar6._M_node ==
             &(this->OldLinkDirMask)._M_t._M_impl.super__Rb_tree_header;
    bVar3 = true;
  }
  if ((bVar3) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2)) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (bVar11) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->OldLinkDirItems,(value_type *)entry);
  }
  bVar3 = cmGeneratorTarget::IsFrameworkOnApple(local_160);
  if ((!bVar3) ||
     (iVar5 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x27])(), (char)iVar5 != '\0')) {
    local_60 = (FeatureDescriptor *)CONCAT44(local_60._4_4_,1);
    sVar8 = (entry->Feature)._M_string_length;
    if ((sVar8 == cmComputeLinkDepends::LinkEntry::DEFAULT_abi_cxx11_._M_string_length) &&
       ((sVar8 == 0 ||
        (iVar5 = bcmp((entry->Feature)._M_dataplus._M_p,
                      cmComputeLinkDepends::LinkEntry::DEFAULT_abi_cxx11_._M_dataplus._M_p,sVar8),
        iVar5 == 0)))) {
      bVar3 = cmGeneratorTarget::IsFrameworkOnApple(local_160);
      if (bVar3) {
        iVar5 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x27])();
        __s = "__CMAKE_LINK_LIBRARY";
        if ((char)iVar5 != '\0') {
          __s = "__CMAKE_LINK_FRAMEWORK";
        }
      }
      else {
        __s = "__CMAKE_LINK_LIBRARY";
      }
      local_e8._0_8_ = local_e8 + 0x10;
      sVar8 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,__s,__s + sVar8);
    }
    else {
      local_e8._0_8_ = local_e8 + 0x10;
      pcVar1 = (entry->Feature)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>((string *)local_e8,pcVar1,pcVar1 + sVar8);
    }
    cVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>_>
            ::find(&(this->LibraryFeatureDescriptors)._M_t,(key_type *)local_e8);
    local_138._0_8_ = (FeatureDescriptor *)0x0;
    if ((_Rb_tree_header *)cVar9._M_node !=
        &(this->LibraryFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header) {
      local_138._0_8_ = (FeatureDescriptor *)(cVar9._M_node + 2);
    }
    std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
    emplace_back<BT<std::__cxx11::string>const&,cmComputeLinkInformation::ItemIsPath,cmGeneratorTarget_const*&,cmComputeLinkInformation::FeatureDescriptor_const*>
              ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                *)this,&entry->Item,(ItemIsPath *)&local_60,&local_160,
               (FeatureDescriptor **)local_138);
    if ((undefined1 *)local_e8._0_8_ == local_e8 + 0x10) {
      return;
    }
    operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
    return;
  }
  cmGlobalGenerator::SplitFrameworkPath
            ((optional<cmGlobalGenerator::FrameworkDescriptor> *)local_e8,this->GlobalGenerator,
             (string *)entry,Extended);
  if (local_88 == false) {
    this_00 = this->CMakeInstance;
    pcVar1 = (entry->Item).Value._M_dataplus._M_p;
    sVar2 = (entry->Item).Value._M_string_length;
    psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    local_138._0_8_ = (FeatureDescriptor *)0x20;
    local_138._8_8_ = "Could not parse framework path \"";
    local_118 = 0x13;
    local_110 = "\" linked by target ";
    local_100 = (psVar7->_M_dataplus)._M_p;
    local_108 = psVar7->_M_string_length;
    local_f0 = local_50;
    local_60 = (FeatureDescriptor *)&DAT_00000001;
    local_50[0] = 0x2e;
    local_f8 = 1;
    views._M_len = 5;
    views._M_array = (iterator)local_138;
    local_138._16_8_ = sVar2;
    local_138._24_8_ = pcVar1;
    local_58 = local_f0;
    cmCatViews_abi_cxx11_((string *)local_158,views);
    cmake::IssueMessage(this_00,FATAL_ERROR,(string *)local_158,&(entry->Item).Backtrace);
    pFVar10 = (FeatureDescriptor *)CONCAT44(local_158._4_4_,local_158._0_4_);
    if ((FeatureDescriptor *)CONCAT44(local_158._4_4_,local_158._0_4_) ==
        (FeatureDescriptor *)(local_158 + 0x10)) goto LAB_0037dd4e;
  }
  else {
    if ((local_e8._8_8_ != 0) &&
       (pVar12 = std::
                 _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 ::_M_insert_unique<std::__cxx11::string_const&>
                           ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                             *)&this->FrameworkPathsEmitted,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_e8),
       ((undefined1  [16])pVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->FrameworkPaths,(value_type *)local_e8);
    }
    psVar7 = &entry->Feature;
    local_138._8_8_ = (entry->Feature)._M_dataplus._M_p;
    local_138._0_8_ = (entry->Feature)._M_string_length;
    if (((ulong)local_138._0_8_ < (FeatureDescriptor *)0x9) ||
       (__str._M_str = "FRAMEWORK", __str._M_len = 9,
       iVar5 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                         ((basic_string_view<char,_std::char_traits<char>_> *)local_138,
                          (size_type)
                          ((long)&(((FeatureDescriptor *)(local_138._0_8_ + -0xa8))->ItemNameFormat)
                                  .field_2 + 7),9,__str), iVar5 != 0)) {
      local_158._0_4_ = Yes;
      sVar8 = (entry->Feature)._M_string_length;
      if ((sVar8 == cmComputeLinkDepends::LinkEntry::DEFAULT_abi_cxx11_._M_string_length) &&
         ((sVar8 == 0 ||
          (iVar5 = bcmp((psVar7->_M_dataplus)._M_p,
                        cmComputeLinkDepends::LinkEntry::DEFAULT_abi_cxx11_._M_dataplus._M_p,sVar8),
          iVar5 == 0)))) {
        local_138._0_8_ = local_138 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_138,"__CMAKE_LINK_LIBRARY","");
      }
      else {
        local_138._0_8_ = local_138 + 0x10;
        pcVar1 = (psVar7->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>((string *)local_138,pcVar1,pcVar1 + sVar8);
      }
      cVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>_>
              ::find(&(this->LibraryFeatureDescriptors)._M_t,(key_type *)local_138);
      local_60 = (FeatureDescriptor *)0x0;
      if ((_Rb_tree_header *)cVar9._M_node !=
          &(this->LibraryFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header) {
        local_60 = (FeatureDescriptor *)(cVar9._M_node + 2);
      }
      std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
      emplace_back<BT<std::__cxx11::string>const&,cmComputeLinkInformation::ItemIsPath,cmGeneratorTarget_const*&,cmComputeLinkInformation::FeatureDescriptor_const*>
                ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                  *)this,&entry->Item,(ItemIsPath *)local_158,&local_160,&local_60);
    }
    else {
      cmGlobalGenerator::FrameworkDescriptor::GetLinkName_abi_cxx11_
                ((string *)local_138,(FrameworkDescriptor *)local_e8);
      local_158._0_4_ = Yes;
      cVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmComputeLinkInformation::FeatureDescriptor>_>_>
              ::find(&(this->LibraryFeatureDescriptors)._M_t,psVar7);
      local_60 = (FeatureDescriptor *)0x0;
      if ((_Rb_tree_header *)cVar9._M_node !=
          &(this->LibraryFeatureDescriptors)._M_t._M_impl.super__Rb_tree_header) {
        local_60 = (FeatureDescriptor *)(cVar9._M_node + 2);
      }
      std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
      emplace_back<std::__cxx11::string,cmComputeLinkInformation::ItemIsPath,cmGeneratorTarget_const*&,cmComputeLinkInformation::FeatureDescriptor_const*>
                ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                  *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_138,(ItemIsPath *)local_158,&local_160,&local_60);
    }
    local_158._16_8_ = local_138._16_8_;
    pFVar10 = (FeatureDescriptor *)local_138._0_8_;
    if ((FeatureDescriptor *)local_138._0_8_ == (FeatureDescriptor *)(local_138 + 0x10))
    goto LAB_0037dd4e;
  }
  operator_delete(pFVar10,local_158._16_8_ + 1);
LAB_0037dd4e:
  if (local_88 == true) {
    std::_Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor>::_M_destroy
              ((_Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor> *)local_e8);
  }
  return;
}

Assistant:

void cmComputeLinkInformation::AddTargetItem(LinkEntry const& entry)
{
  // This is called to handle a link item that is a full path to a target.
  // If the target is not a static library make sure the link type is
  // shared.  This is because dynamic-mode linking can handle both
  // shared and static libraries but static-mode can handle only
  // static libraries.  If a previous user item changed the link type
  // to static we need to make sure it is back to shared.
  BT<std::string> const& item = entry.Item;
  cmGeneratorTarget const* target = entry.Target;

  if (target->GetType() != cmStateEnums::STATIC_LIBRARY) {
    this->SetCurrentLinkType(LinkShared);
  }

  // Keep track of shared library targets linked.
  if (target->GetType() == cmStateEnums::SHARED_LIBRARY) {
    this->SharedLibrariesLinked.insert(target);
  }

  // Handle case of an imported shared library with no soname.
  if (this->NoSONameUsesPath &&
      target->IsImportedSharedLibWithoutSOName(this->Config)) {
    this->AddSharedLibNoSOName(entry);
    return;
  }

  // For compatibility with CMake 2.4 include the item's directory in
  // the linker search path.
  if (this->OldLinkDirMode && !target->IsFrameworkOnApple() &&
      !cm::contains(this->OldLinkDirMask,
                    cmSystemTools::GetFilenamePath(item.Value))) {
    this->OldLinkDirItems.push_back(item.Value);
  }

  if (target->IsFrameworkOnApple() && !this->GlobalGenerator->IsXcode()) {
    // Add the framework directory and the framework item itself
    auto fwDescriptor = this->GlobalGenerator->SplitFrameworkPath(
      item.Value, cmGlobalGenerator::FrameworkFormat::Extended);
    if (!fwDescriptor) {
      this->CMakeInstance->IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat("Could not parse framework path \"", item.Value,
                 "\" linked by target ", this->Target->GetName(), '.'),
        item.Backtrace);
      return;
    }
    if (!fwDescriptor->Directory.empty()) {
      // Add the directory portion to the framework search path.
      this->AddFrameworkPath(fwDescriptor->Directory);
    }
    if (cmHasSuffix(entry.Feature, "FRAMEWORK"_s)) {
      this->Items.emplace_back(fwDescriptor->GetLinkName(), ItemIsPath::Yes,
                               target,
                               this->FindLibraryFeature(entry.Feature));
    } else {
      this->Items.emplace_back(
        item, ItemIsPath::Yes, target,
        this->FindLibraryFeature(
          entry.Feature == DEFAULT ? "__CMAKE_LINK_LIBRARY" : entry.Feature));
    }
  } else {
    // Now add the full path to the library.
    this->Items.emplace_back(
      item, ItemIsPath::Yes, target,
      this->FindLibraryFeature(
        entry.Feature == DEFAULT
          ? (target->IsFrameworkOnApple() && this->GlobalGenerator->IsXcode()
               ? "__CMAKE_LINK_FRAMEWORK"
               : "__CMAKE_LINK_LIBRARY")
          : entry.Feature));
  }
}